

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vending_machine.hpp
# Opt level: O1

void __thiscall vending::vending_def::add_goods(vending_def *this,load_goods *entry)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  load_done local_11;
  goods_entry local_10;
  
  p_Var3 = (this->goods)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->goods)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar4 = *(ulong *)(p_Var3 + 1) < entry->p_no;
      if (!bVar4) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2, entry->p_no < *(ulong *)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    local_10.amount = entry->amount;
    local_10.price = 0.0;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,vending::goods_entry>,std::_Select1st<std::pair<unsigned_long_const,vending::goods_entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
    ::_M_emplace_unique<unsigned_long&,vending::goods_entry>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,vending::goods_entry>,std::_Select1st<std::pair<unsigned_long_const,vending::goods_entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
                *)&this->goods,&entry->p_no,&local_10);
  }
  else {
    *(int *)&p_Var3[1]._M_parent = *(int *)&p_Var3[1]._M_parent + entry->amount;
  }
  afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::process_event<vending::events::load_done>
            ((state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
              *)this,&local_11);
  return;
}

Assistant:

void
    add_goods(events::load_goods&& entry)
    {
        auto f = goods.find(entry.p_no);
        if (f == goods.end()) {
            goods.emplace(entry.p_no, goods_entry{entry.amount, 0});
        } else {
            f->second.amount += entry.amount;
        }
        rebind().process_event(events::load_done{});
    }